

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtExternalObject.cpp
# Opt level: O2

JsrtExternalObject * __thiscall JsrtExternalObject::Copy(JsrtExternalObject *this,bool deepCopy)

{
  Type *pTVar1;
  Recycler *pRVar2;
  JsrtExternalObject *this_00;
  Type TVar3;
  code *AllocFunc;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  pRVar2 = Js::RecyclableObject::GetRecycler((RecyclableObject *)this);
  pTVar1 = (this->super_DynamicObject).super_RecyclableObject.type.ptr;
  TVar3 = 0;
  if (this->slotType != External) {
    TVar3 = (this->u).inlineSlotSize;
  }
  if (pTVar1[1].entryPoint == (Type)0x0) {
    data.typeinfo = (type_info *)(long)(int)TVar3;
    if (pTVar1[1].prototype.ptr == (RecyclableObject *)0x0) {
      local_48 = (undefined1  [8])&typeinfo;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_414e33;
      data.filename._0_4_ = 0xb2;
      pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,(TrackAllocData *)local_48);
      AllocFunc = Memory::Recycler::Alloc;
    }
    else {
      local_48 = (undefined1  [8])&typeinfo;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_414e33;
      data.filename._0_4_ = 0xaf;
      pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,(TrackAllocData *)local_48);
      AllocFunc = Memory::Recycler::AllocFinalized;
    }
  }
  else {
    data.typeinfo = (type_info *)(long)(int)TVar3;
    local_48 = (undefined1  [8])&typeinfo;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_414e33;
    data.filename._0_4_ = 0xa9;
    pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,(TrackAllocData *)local_48);
    AllocFunc = Memory::Recycler::AllocTracked;
  }
  this_00 = (JsrtExternalObject *)
            new<Memory::Recycler>(0x30,pRVar2,(offset_in_Recycler_to_subr)AllocFunc,0);
  JsrtExternalObject(this_00,this,deepCopy);
  return this_00;
}

Assistant:

JsrtExternalObject* JsrtExternalObject::Copy(bool deepCopy)
{
    Recycler* recycler = this->GetRecycler();
    JsrtExternalType* type = this->GetExternalType();
    int inlineSlotSize = this->GetInlineSlotSize();

#ifdef _CHAKRACOREBUILD
    if (type->GetJsTraceCallback() != nullptr)
    {
        return RecyclerNewTrackedPlus(recycler, inlineSlotSize, JsrtExternalObject, this, deepCopy);
    }
#endif

    if (type->GetJsFinalizeCallback() != nullptr)
    {
        return RecyclerNewFinalizedPlus(recycler, inlineSlotSize, JsrtExternalObject, this, deepCopy);
    }

    return RecyclerNewPlus(recycler, inlineSlotSize, JsrtExternalObject, this, deepCopy);
}